

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_sizeof_CCtx(ZSTDMT_CCtx *mtctx)

{
  uint uVar1;
  uint uVar2;
  POOL_ctx *pPVar3;
  pthread_mutex_t *__mutex;
  ZSTD_CDict *pZVar4;
  ZSTD_CDict *pZVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  if (mtctx == (ZSTDMT_CCtx *)0x0) {
    return 0;
  }
  pPVar3 = mtctx->factory;
  if (pPVar3 == (POOL_ctx *)0x0) {
    lVar12 = 0xc60;
  }
  else {
    lVar12 = pPVar3->queueSize * 0x10 + pPVar3->threadCapacity * 8 + 0xd50;
  }
  sVar6 = ZSTDMT_sizeof_bufferPool(mtctx->bufPool);
  uVar1 = mtctx->jobIDMask;
  __mutex = (pthread_mutex_t *)mtctx->cctxPool;
  pthread_mutex_lock(__mutex);
  uVar2 = __mutex[1].__data.__lock;
  uVar11 = (ulong)uVar2;
  if (uVar11 == 0) {
    pthread_mutex_unlock(__mutex);
  }
  else {
    uVar13 = 0;
    lVar9 = 0;
    do {
      sVar7 = ZSTD_sizeof_CCtx(*(ZSTD_CCtx **)((long)__mutex + uVar13 * 8 + 0x48));
      lVar9 = lVar9 + sVar7;
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
    pthread_mutex_unlock(__mutex);
    if (uVar11 != 0) {
      sVar7 = ZSTDMT_sizeof_bufferPool(mtctx->seqPool);
      pZVar4 = mtctx->cdictLocal;
      if (pZVar4 == (ZSTD_CDict *)0x0) {
        lVar8 = 0;
      }
      else {
        pZVar5 = (ZSTD_CDict *)(pZVar4->workspace).workspace;
        lVar10 = (long)(pZVar4->workspace).workspaceEnd - (long)pZVar5;
        lVar8 = lVar10 + 0x17c0;
        if (pZVar5 == pZVar4) {
          lVar8 = lVar10;
        }
      }
      return lVar12 + sVar6 + (ulong)(uVar1 + 1) * 0x1b8 + (ulong)(uVar2 - 1) * 8 + sVar7 + lVar9 +
             lVar8 + (mtctx->roundBuff).capacity;
    }
  }
  __assert_fail("nbWorkers > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x8684,"size_t ZSTDMT_sizeof_CCtxPool(ZSTDMT_CCtxPool *)");
}

Assistant:

size_t ZSTDMT_sizeof_CCtx(ZSTDMT_CCtx* mtctx)
{
    if (mtctx == NULL) return 0;   /* supports sizeof NULL */
    return sizeof(*mtctx)
            + POOL_sizeof(mtctx->factory)
            + ZSTDMT_sizeof_bufferPool(mtctx->bufPool)
            + (mtctx->jobIDMask+1) * sizeof(ZSTDMT_jobDescription)
            + ZSTDMT_sizeof_CCtxPool(mtctx->cctxPool)
            + ZSTDMT_sizeof_seqPool(mtctx->seqPool)
            + ZSTD_sizeof_CDict(mtctx->cdictLocal)
            + mtctx->roundBuff.capacity;
}